

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_contains_all(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  bitset_t *bitset;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  size_t shiftedi;
  ulong uVar10;
  int i;
  ulong uVar11;
  ulong auStack_68 [5];
  bitset_t *pbStack_40;
  bitset_t *pbStack_38;
  code *pcStack_30;
  
  pcStack_30 = (code *)0x102453;
  pbVar3 = bitset_create();
  uVar11 = 0;
  pcStack_30 = (code *)0x10245e;
  bitset = bitset_create();
  do {
    uVar10 = uVar11 >> 6;
    if (uVar10 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar10] = pbVar3->array[uVar10] | 1L << ((byte)uVar11 & 0x3f);
    }
    else {
      pcStack_30 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar10 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar11 & 1) == 0) {
      if (bitset->arraysize <= uVar10) {
        pcStack_30 = (code *)0x1024aa;
        _Var2 = bitset_grow(bitset,uVar10 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      bitset->array[uVar10] = bitset->array[uVar10] | 1L << ((byte)uVar11 & 0x3e);
    }
LAB_001024c3:
    uVar11 = uVar11 + 1;
  } while (uVar11 != 1000);
  pcStack_30 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,bitset);
  if (_Var2) {
    pcStack_30 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(bitset,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (bitset->arraysize < 0x10) {
      pcStack_30 = (code *)0x102501;
      _Var2 = bitset_grow(bitset,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      bitset->array[0xf] = bitset->array[0xf] | 0x20000000000;
    }
    pcStack_30 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,bitset);
    if (!_Var2) {
      pcStack_30 = (code *)0x102530;
      _Var2 = bitset_contains_all(bitset,pbVar3);
      if (!_Var2) {
        pcStack_30 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(bitset);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_30 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_30 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_30 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_30 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar10 = 0;
  pbStack_40 = pbVar3;
  pbStack_38 = bitset;
  pcStack_30 = (code *)uVar11;
  pbVar3 = bitset_create();
  do {
    uVar11 = uVar10 >> 6;
    if (uVar11 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar10 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 100);
  uVar11 = 0x3e6;
  do {
    uVar11 = uVar11 + 2;
    uVar10 = uVar11 >> 6;
    if (uVar10 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar10] = pbVar3->array[uVar10] | 1L << ((byte)uVar11 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar10 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar11 < 0x44a);
  uVar11 = pbVar3->arraysize;
  if (uVar11 != 0) {
    puVar1 = pbVar3->array;
    uVar9 = 0;
    uVar10 = 0;
    lVar6 = 0;
    do {
      uVar7 = (puVar1[uVar9] >> ((byte)uVar10 & 0x3f)) << ((byte)uVar10 & 0x3f);
      uVar10 = uVar10 & 0xffffffffffffffc0;
      uVar4 = 0;
      do {
        while (uVar7 == 0) {
          uVar9 = uVar9 + 1;
          if (uVar9 == uVar11) {
            lVar8 = lVar6;
            if (uVar4 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar10 = uVar10 + 0x40;
          uVar7 = puVar1[uVar9];
          if (2 < uVar4) goto LAB_0010265a;
        }
        uVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        auStack_68[uVar4 + 1] = uVar5 | uVar10;
        uVar4 = uVar4 + 1;
        uVar7 = uVar7 & uVar7 - 1;
      } while (uVar4 != 3);
      uVar4 = 3;
LAB_0010265a:
      lVar8 = lVar6 + uVar4;
      uVar10 = lVar6 * 2 + 800;
      uVar9 = 0;
      do {
        uVar5 = lVar6 + uVar9;
        if (99 < lVar6 + uVar9) {
          uVar5 = uVar10;
        }
        if (auStack_68[uVar9 + 1] != uVar5) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar9 = uVar9 + 1;
        uVar10 = uVar10 + 2;
      } while (uVar4 != uVar9);
      uVar10 = auStack_68[uVar4] + 1;
      uVar9 = uVar10 >> 6;
      lVar6 = lVar8;
    } while (uVar9 < uVar11);
LAB_001026ac:
    if (lVar8 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar11 = 0;
  pbVar3 = bitset_create();
  do {
    uVar10 = uVar11 >> 6;
    if ((uVar10 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar10 + 1), _Var2)) {
      pbVar3->array[uVar10] = pbVar3->array[uVar10] | 1L << ((byte)uVar11 & 0x3f);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  uVar11 = 0x3e6;
  do {
    uVar11 = uVar11 + 2;
    uVar10 = uVar11 >> 6;
    if ((uVar10 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar10 + 1), _Var2)) {
      pbVar3->array[uVar10] = pbVar3->array[uVar10] | 1L << ((byte)uVar11 & 0x3e);
    }
  } while (uVar11 < 0x44a);
  uVar11 = pbVar3->arraysize;
  if (uVar11 != 0) {
    uVar4 = 0;
    uVar9 = 0;
    uVar10 = 0;
    do {
      uVar5 = pbVar3->array[uVar4] >> ((byte)uVar10 & 0x3f);
      if (uVar5 == 0) {
        lVar6 = uVar4 * -0x40;
        do {
          uVar4 = uVar4 + 1;
          if (uVar11 == uVar4) goto LAB_001027db;
          uVar10 = pbVar3->array[uVar4];
          lVar6 = lVar6 + -0x40;
        } while (uVar10 == 0);
        lVar8 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar10 = lVar8 - lVar6;
      }
      else {
        lVar6 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar10 = uVar10 + lVar6;
      }
      uVar4 = uVar9 * 2 + 800;
      if (uVar9 < 100) {
        uVar4 = uVar9;
      }
      if (uVar10 != uVar4) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar9 = uVar9 + 1;
      uVar10 = uVar10 + 1;
      uVar4 = uVar10 >> 6;
    } while (uVar4 < uVar11);
LAB_001027db:
    if (uVar9 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_contains_all() {
  bitset_t *superset = bitset_create();
  bitset_t *subset = bitset_create();

  for (int i = 0; i < 1000; i++) {
    bitset_set(superset, i);
    if (i % 2 == 0)
      bitset_set(subset, i);
  }

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_set(subset, 1001);

  TEST_ASSERT(!bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}